

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O2

void __thiscall NNTreeIterator::updateIValue(NNTreeIterator *this,bool allow_invalid)

{
  QPDFObjectHandle *key;
  int iVar1;
  QPDF *qpdf;
  string *psVar2;
  bool bVar3;
  int iVar4;
  logic_error *this_00;
  undefined8 extraout_RAX;
  allocator<char> local_59;
  string local_58;
  QPDFObjectHandle items;
  
  if (-1 < this->item_number) {
    key = &this->node;
    bVar3 = QPDFObjectHandle::isDictionary(key);
    if (bVar3) {
      (*(code *)**(undefined8 **)this->impl->details)();
      QPDFObjectHandle::getKey(&items,(string *)key);
      iVar1 = this->item_number;
      iVar4 = QPDFObjectHandle::getArrayNItems(&items);
      if (iVar4 <= iVar1 + 1) {
        qpdf = this->impl->qpdf;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"update ivalue: items array is too short",&local_59);
        ::error(qpdf,key,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&items.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        _Unwind_Resume(extraout_RAX);
      }
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&local_58,(int)&items);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&this->ivalue,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&local_58,(int)&items);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&(this->ivalue).second,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
      psVar2 = (string *)&items.super_BaseHandle;
      goto LAB_00124e55;
    }
  }
  if (!allow_invalid) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"attempt made to dereference an invalid name/number tree iterator");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&this->ivalue,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&(this->ivalue).second,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
  psVar2 = &local_58;
LAB_00124e55:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&psVar2->_M_string_length);
  return;
}

Assistant:

void
NNTreeIterator::updateIValue(bool allow_invalid)
{
    // ivalue should never be used inside the class since we return a pointer/reference to it. Every
    // bit of code that ever changes what object the iterator points to should take care to call
    // updateIValue. Failure to do this means that any old references to *iter will point to
    // incorrect objects, though the next dereference of the iterator will fix it. This isn't
    // necessarily catastrophic, but it would be confusing. The test suite attempts to exercise
    // various cases to ensure we don't introduce that bug in the future, but sadly it's tricky to
    // verify by reasoning about the code that this constraint is always satisfied. Whenever we
    // update what the iterator points to, we should call setItemNumber, which calls this. If we
    // change what the iterator points to in some other way, such as replacing a value or removing
    // an item and making the iterator point at a different item in potentially the same position,
    // we must call updateIValue as well. These cases are handled, and for good measure, we also
    // call updateIValue in operator* and operator->.

    bool okay = false;
    if ((item_number >= 0) && this->node.isDictionary()) {
        auto items = this->node.getKey(impl.details.itemsKey());
        if (this->item_number + 1 < items.getArrayNItems()) {
            okay = true;
            this->ivalue.first = items.getArrayItem(this->item_number);
            this->ivalue.second = items.getArrayItem(1 + this->item_number);
        } else {
            error(impl.qpdf, node, "update ivalue: items array is too short");
        }
    }
    if (!okay) {
        if (!allow_invalid) {
            throw std::logic_error(
                "attempt made to dereference an invalid name/number tree iterator");
        }
        this->ivalue.first = QPDFObjectHandle();
        this->ivalue.second = QPDFObjectHandle();
    }
}